

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

size_t __thiscall
ddd::DaTrie<false,_false,_false>::edge_size_
          (DaTrie<false,_false,_false> *this,uint32_t node_pos,size_t upper)

{
  pointer pBVar1;
  Bc BVar2;
  size_t sVar3;
  uint uVar4;
  uint32_t label;
  uint uVar5;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  BVar2 = pBVar1[node_pos];
  if ((long)BVar2 < 0) {
    uVar4 = BVar2._0_4_;
    if (((int)uVar4 < 0) || (uVar5 = 0, uVar4 == 0x7fffffff)) {
      sVar3 = 0;
    }
    else {
      sVar3 = 0;
      while ((uVar5 != 0x100 &&
             (((*(uint *)&pBVar1[uVar5 ^ uVar4].field_0x4 & 0x7fffffff) != node_pos ||
              (sVar3 = sVar3 + 1, sVar3 < upper))))) {
        uVar5 = uVar5 + 1;
      }
    }
    return sVar3;
  }
  __assert_fail("bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x3f8,
                "size_t ddd::DaTrie<false, false, false>::edge_size_(uint32_t, size_t) const [WithBLM = false, WithNLM = false, Prefix = false]"
               );
}

Assistant:

size_t edge_size_(uint32_t node_pos, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    if (bc_[node_pos].is_leaf()) {
      return 0;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return 0;
    }

    size_t size = 0;
    if (WithNLM) {
      auto child_pos = base ^node_links_[node_pos].child;
      while (++size < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        child_pos = base ^ node_links_[child_pos].sib;
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos && ++size >= upper) {
          break;
        }
      }
    }
    return size;
  }